

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  int iVar1;
  secp256k1_fe *in_RCX;
  secp256k1_ge *in_RDX;
  void *in_RSI;
  secp256k1_gej *in_RDI;
  secp256k1_fe bzinv3;
  secp256k1_fe bzinv2;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe s2;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_fe az;
  secp256k1_gej *in_stack_fffffffffffffdd8;
  secp256k1_gej *in_stack_fffffffffffffde0;
  secp256k1_fe local_1d8;
  secp256k1_fe local_1b0;
  secp256k1_fe local_188;
  secp256k1_fe local_160;
  secp256k1_fe local_138;
  secp256k1_fe local_110;
  secp256k1_fe local_e8;
  secp256k1_fe local_c0;
  secp256k1_fe local_98 [3];
  secp256k1_fe *local_20;
  secp256k1_ge *local_18;
  void *local_10;
  secp256k1_gej *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_ge_verify(in_RDX);
  secp256k1_fe_verify(local_20);
  if (*(int *)((long)local_10 + 0x78) == 0) {
    if (local_18->infinity == 0) {
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                 (secp256k1_fe *)0x12cbf3);
      secp256k1_fe_impl_sqr(&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x);
      memcpy(local_98,local_10,0x28);
      secp256k1_fe_impl_normalize_weak(local_98);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                 (secp256k1_fe *)0x12cc4c);
      memcpy(&local_e8,(void *)((long)local_10 + 0x28),0x28);
      secp256k1_fe_impl_normalize_weak(&local_e8);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                 (secp256k1_fe *)0x12cc98);
      secp256k1_fe_impl_mul
                (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                 (secp256k1_fe *)0x12ccb0);
      secp256k1_fe_impl_negate_unchecked(&local_138,local_98,1);
      secp256k1_fe_impl_add(&local_138,&local_c0);
      secp256k1_fe_impl_negate_unchecked(&local_160,&local_110,1);
      secp256k1_fe_impl_add(&local_160,&local_e8);
      iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_138);
      if (iVar1 == 0) {
        local_8->infinity = 0;
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                   (secp256k1_fe *)0x12cd93);
        secp256k1_fe_impl_sqr(&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x);
        secp256k1_fe_impl_negate_unchecked(&local_188,&local_188,1);
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                   (secp256k1_fe *)0x12cdd7);
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                   (secp256k1_fe *)0x12cdf1);
        secp256k1_fe_impl_sqr(&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x);
        secp256k1_fe_impl_add(&local_8->x,&local_1b0);
        secp256k1_fe_impl_add(&local_8->x,&local_1d8);
        secp256k1_fe_impl_add(&local_8->x,&local_1d8);
        secp256k1_fe_impl_add(&local_1d8,&local_8->x);
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                   (secp256k1_fe *)0x12ce6c);
        secp256k1_fe_impl_mul
                  (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,
                   (secp256k1_fe *)0x12ce81);
        secp256k1_fe_impl_add(&local_8->y,&local_1b0);
        secp256k1_gej_verify(local_8);
      }
      else {
        iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_160);
        if (iVar1 == 0) {
          secp256k1_gej_set_infinity((secp256k1_gej *)0x12cd5a);
        }
        else {
          secp256k1_gej_double_var
                    (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(secp256k1_fe *)0x12cd4b);
        }
      }
    }
    else {
      memcpy(local_8,local_10,0x80);
    }
  }
  else {
    local_8->infinity = local_18->infinity;
    secp256k1_fe_impl_sqr(&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x);
    secp256k1_fe_impl_mul
              (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,(secp256k1_fe *)0x12cb50)
    ;
    secp256k1_fe_impl_mul
              (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,(secp256k1_fe *)0x12cb6a)
    ;
    secp256k1_fe_impl_mul
              (&in_stack_fffffffffffffde0->x,&in_stack_fffffffffffffdd8->x,(secp256k1_fe *)0x12cb8a)
    ;
    secp256k1_fe_impl_set_int(&local_8->z,1);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* 9 mul, 3 sqr, 13 add/negate/normalize_weak/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, h2, h3, t;

    secp256k1_ge_verify(b);
    secp256k1_fe_verify(bzinv);
    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        return;
    }
    if (b->infinity) {
        *r = *a;
        return;
    }

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);
    secp256k1_gej_verify(r);
}